

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O0

bool cmExecProgramCommand::RunCommand
               (char *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  string local_130 [8];
  string msg;
  string local_f0;
  undefined1 local_d0 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_a8;
  int p;
  char *data;
  char *pcStack_98;
  int length;
  char *cmd [4];
  string local_60 [8];
  string commandInDir;
  cmsysProcess *cp;
  Encoding encoding_local;
  bool verbose_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  char *command_local;
  
  bVar1 = cmSystemTools::GetRunCommandOutput();
  cp._7_1_ = verbose;
  if (bVar1) {
    cp._7_1_ = 0;
  }
  commandInDir.field_2._8_8_ = cmsysProcess_New();
  if ((cmsysProcess *)commandInDir.field_2._8_8_ == (cmsysProcess *)0x0) {
    cmSystemTools::Error("Error allocating process instance.",(char *)0x0,(char *)0x0,(char *)0x0);
    command_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string(local_60);
    if (dir == (char *)0x0) {
      std::__cxx11::string::operator=(local_60,command);
    }
    else {
      std::__cxx11::string::operator=(local_60,"cd \"");
      std::__cxx11::string::operator+=(local_60,dir);
      std::__cxx11::string::operator+=(local_60,"\" && ");
      std::__cxx11::string::operator+=(local_60,command);
    }
    std::__cxx11::string::operator+=(local_60," 2>&1");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    if ((cp._7_1_ & 1) != 0) {
      cmSystemTools::Stdout("running ");
      cmSystemTools::Stdout(pcVar3);
      cmSystemTools::Stdout("\n");
    }
    fflush(_stdout);
    fflush(_stderr);
    pcStack_98 = "/bin/sh";
    cmd[0] = "-c";
    cmd[2] = (char *)0x0;
    cmd[1] = pcVar3;
    cmsysProcess_SetCommand((cmsysProcess *)commandInDir.field_2._8_8_,&stack0xffffffffffffff68);
    cmsysProcess_Execute((cmsysProcess *)commandInDir.field_2._8_8_);
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_d0);
    while (strdata.field_2._12_4_ =
                cmsysProcess_WaitForData
                          ((cmsysProcess *)commandInDir.field_2._8_8_,&stack0xffffffffffffff58,
                           (int *)((long)&data + 4),(double *)0x0), strdata.field_2._12_4_ != 0) {
      if ((strdata.field_2._12_4_ == 2) || (strdata.field_2._12_4_ == 3)) {
        if ((cp._7_1_ & 1) != 0) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_a8,
                     (long)data._4_4_,(string *)local_d0,0);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          sVar4 = std::__cxx11::string::size();
          cmSystemTools::Stdout(pcVar3,sVar4);
        }
        std::__cxx11::string::append((char *)output,(ulong)pcStack_a8);
      }
    }
    if ((cp._7_1_ & 1) != 0) {
      std::__cxx11::string::string((string *)&local_f0);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_f0,
                 (string *)local_d0,0);
      std::__cxx11::string::~string((string *)&local_f0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        sVar4 = std::__cxx11::string::size();
        cmSystemTools::Stdout(pcVar3,sVar4);
      }
    }
    cmsysProcess_WaitForExit((cmsysProcess *)commandInDir.field_2._8_8_,(double *)0x0);
    std::__cxx11::string::string((string *)(msg.field_2._M_local_buf + 8),(string *)output);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),
               (string *)((long)&msg.field_2 + 8),output,0);
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_130);
    iVar2 = cmsysProcess_GetState((cmsysProcess *)commandInDir.field_2._8_8_);
    switch(iVar2) {
    case 1:
      *retVal = -1;
      std::__cxx11::string::operator+=(local_130,"\nProcess failed because: ");
      pcVar3 = cmsysProcess_GetErrorString((cmsysProcess *)commandInDir.field_2._8_8_);
      std::__cxx11::string::operator+=(local_130,pcVar3);
      break;
    case 2:
      *retVal = -1;
      std::__cxx11::string::operator+=(local_130,"\nProcess terminated due to: ");
      pcVar3 = cmsysProcess_GetExceptionString((cmsysProcess *)commandInDir.field_2._8_8_);
      std::__cxx11::string::operator+=(local_130,pcVar3);
      break;
    case 4:
      iVar2 = cmsysProcess_GetExitValue((cmsysProcess *)commandInDir.field_2._8_8_);
      *retVal = iVar2;
      break;
    case 5:
      *retVal = -1;
      std::__cxx11::string::operator+=(local_130,"\nProcess terminated due to timeout.");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)output,local_130);
    }
    cmsysProcess_Delete((cmsysProcess *)commandInDir.field_2._8_8_);
    command_local._7_1_ = true;
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)local_d0);
    cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb));
    std::__cxx11::string::~string(local_60);
  }
  return command_local._7_1_;
}

Assistant:

bool cmExecProgramCommand::RunCommand(const char* command, std::string& output,
                                      int& retVal, const char* dir,
                                      bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  int count = 0;
  std::string shortCmd;
  if (command[0] == '\"') {
    // count the number of quotes
    for (const char* s = command; *s != 0; ++s) {
      if (*s == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd.c_str())) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd.c_str(), shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for ", cmd.c_str());
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd.c_str();
      } else {
        cmSystemTools::Error("Could not parse command line with quotes ",
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command, 0 };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = "cd \"";
    commandInDir += dir;
    commandInDir += "\" && ";
    commandInDir += command;
  } else {
    commandInDir = command;
  }
#ifndef __VMS
  commandInDir += " 2>&1";
#endif
  command = commandInDir.c_str();
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command, CM_NULLPTR };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR), p)) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata.c_str(), strdata.size());
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, CM_NULLPTR);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg.c_str());
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}